

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdecode.c
# Opt level: O0

_Bool rcnb_decode_byte(wchar_t *value_in,char **value_out)

{
  byte *pbVar1;
  bool bVar2;
  long *in_RSI;
  wchar_t *in_RDI;
  wchar_t result;
  wchar_t idx [2];
  _Bool nb;
  byte local_30;
  int local_2c;
  wchar_t local_24;
  wchar_t local_20;
  _Bool local_1;
  
  bVar2 = false;
  local_24 = find(L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ",0xf,*in_RDI);
  local_20 = find(L"cCĆćĈĉĊċČčƇƈÇȻȼ",0xf,in_RDI[1]);
  if ((local_24 < L'\0') || (local_20 < L'\0')) {
    local_24 = find(L"nNŃńŅņŇňƝƞÑǸǹȠȵ",0xf,*in_RDI);
    local_20 = find(L"bBƀƁƃƄƅßÞþ",10,in_RDI[1]);
    bVar2 = true;
  }
  if ((local_24 < L'\0') || (local_20 < L'\0')) {
    local_1 = false;
  }
  else {
    if (bVar2) {
      local_2c = local_24 * 10;
    }
    else {
      local_2c = local_24 * 0xf;
    }
    local_2c = local_2c + local_20;
    if (local_2c < 0x80) {
      local_30 = (byte)local_2c;
      if (bVar2) {
        local_30 = local_30 | 0x80;
      }
      pbVar1 = (byte *)*in_RSI;
      *in_RSI = (long)(pbVar1 + 1);
      *pbVar1 = local_30;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool rcnb_decode_byte(const wchar_t* value_in, char** value_out)
{
    bool nb = false;
    int idx[2] = { find(cr, sr, *value_in), find(cc, sc, *(value_in + 1)) };
    if (idx[0] < 0 || idx[1] < 0) {
        idx[0] = find(cn, sn, *value_in);
        idx[1] = find(cb, sb, *(value_in + 1));
        nb = true;
    }
    if (idx[0] < 0 || idx[1] < 0)
        return false;
    int result = nb ? idx[0] * sb + idx[1] : idx[0] * sc + idx[1];
    if (result > 0x7F)
        return false;
    *(*value_out)++ = (char)(nb ? result | 0x80 : result);
    return true;
}